

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_dep_parser.cc
# Opt level: O3

size_t DepParserTask::transition_eager
                 (search *sch,uint64_t a_id,uint32_t idx,uint32_t t_id,uint32_t n)

{
  int *piVar1;
  uint uVar2;
  void *pvVar3;
  ulong uVar4;
  ulong uVar5;
  vw_exception *this;
  float fVar6;
  stringstream __msg;
  uint32_t local_1d4;
  string local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0;
  
  local_1d4 = idx;
  if (3 < a_id - 1) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>(&local_1a0,"transition_eager failed",0x17);
    this = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (this,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/search_dep_parser.cc"
               ,0xf1,&local_1d0);
    __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  pvVar3 = sch->task_data;
  switch(a_id) {
  case 1:
    v_array<unsigned_int>::push_back((v_array<unsigned_int> *)((long)pvVar3 + 0x98),&local_1d4);
    break;
  case 2:
    uVar2 = *(uint *)(*(long *)((long)pvVar3 + 0xa0) + -4);
    uVar4 = (ulong)uVar2;
    v_array<unsigned_int>::push_back((v_array<unsigned_int> *)((long)pvVar3 + 0x98),&local_1d4);
    uVar5 = (ulong)local_1d4;
    *(uint *)(*(long *)((long)pvVar3 + 0xb8) + uVar5 * 4) = uVar2;
    *(undefined4 *)(*(long *)((long)pvVar3 + 0x238) + uVar4 * 4) =
         *(undefined4 *)(*(long *)((long)pvVar3 + 0x218) + uVar4 * 4);
    *(uint32_t *)(*(long *)((long)pvVar3 + 0x218) + uVar4 * 4) = local_1d4;
    piVar1 = (int *)(*(long *)((long)pvVar3 + 0x1b8) + uVar4 * 4);
    *piVar1 = *piVar1 + 1;
    *(uint32_t *)(*(long *)((long)pvVar3 + 0xd8) + uVar5 * 4) = t_id;
    if (*(int *)(*(long *)((long)pvVar3 + 0x58) + uVar5 * 4) ==
        *(int *)(*(long *)((long)pvVar3 + 0xb8) + uVar5 * 4)) {
      fVar6 = 0.0;
      if (*(uint32_t *)(*(long *)((long)pvVar3 + 0x78) + uVar5 * 4) != t_id) {
        fVar6 = 1.0;
      }
    }
    else {
      fVar6 = 2.0;
    }
    Search::search::loss(sch,fVar6);
    break;
  case 3:
    uVar5 = 0;
    if (idx <= n) {
      uVar5 = (ulong)idx;
    }
    uVar2 = *(uint *)(*(long *)((long)pvVar3 + 0xa0) + -4);
    uVar4 = (ulong)uVar2;
    *(int *)(*(long *)((long)pvVar3 + 0xb8) + uVar4 * 4) = (int)uVar5;
    *(undefined4 *)(*(long *)((long)pvVar3 + 0x1f8) + uVar5 * 4) =
         *(undefined4 *)(*(long *)((long)pvVar3 + 0x1d8) + uVar5 * 4);
    *(uint *)(*(long *)((long)pvVar3 + 0x1d8) + uVar5 * 4) = uVar2;
    piVar1 = (int *)(*(long *)((long)pvVar3 + 0x198) + uVar5 * 4);
    *piVar1 = *piVar1 + 1;
    *(uint32_t *)(*(long *)((long)pvVar3 + 0xd8) + uVar4 * 4) = t_id;
    if (*(int *)(*(long *)((long)pvVar3 + 0x58) + uVar4 * 4) ==
        *(int *)(*(long *)((long)pvVar3 + 0xb8) + uVar4 * 4)) {
      fVar6 = 0.0;
      if (*(uint32_t *)(*(long *)((long)pvVar3 + 0x78) + uVar4 * 4) != t_id) {
        fVar6 = 1.0;
      }
    }
    else {
      fVar6 = 2.0;
    }
    Search::search::loss(sch,fVar6);
    *(long *)((long)pvVar3 + 0xa0) = *(long *)((long)pvVar3 + 0xa0) + -4;
    idx = local_1d4;
    goto LAB_0026488c;
  case 4:
    *(long *)((long)pvVar3 + 0xa0) = *(long *)((long)pvVar3 + 0xa0) + -4;
    goto LAB_0026488c;
  }
  idx = local_1d4 + 1;
LAB_0026488c:
  return (ulong)idx;
}

Assistant:

size_t transition_eager(Search::search &sch, uint64_t a_id, uint32_t idx, uint32_t t_id, uint32_t n)
{
  task_data *data = sch.get_task_data<task_data>();
  v_array<uint32_t> &heads = data->heads, &stack = data->stack, &gold_heads = data->gold_heads,
                    &gold_tags = data->gold_tags, &tags = data->tags;
  v_array<uint32_t> *children = data->children;
  if (a_id == SHIFT)
  {
    stack.push_back(idx);
    return idx + 1;
  }
  else if (a_id == REDUCE_RIGHT)
  {
    uint32_t hd = stack.last();
    stack.push_back(idx);
    uint32_t last = idx;
    heads[last] = hd;
    children[5][hd] = children[4][hd];
    children[4][hd] = last;
    children[1][hd]++;
    tags[last] = t_id;
    sch.loss(gold_heads[last] != heads[last] ? 2 : (gold_tags[last] != t_id) ? 1.f : 0.f);
    return idx + 1;
  }
  else if (a_id == REDUCE_LEFT)
  {
    size_t last = stack.last();
    uint32_t hd = (idx > n) ? 0 : idx;
    heads[last] = hd;
    children[3][hd] = children[2][hd];
    children[2][hd] = (uint32_t)last;
    children[0][hd]++;
    tags[last] = t_id;
    sch.loss(gold_heads[last] != heads[last] ? 2 : (gold_tags[last] != t_id) ? 1.f : 0.f);
    assert(!stack.empty());
    stack.pop();
    return idx;
  }
  else if (a_id == REDUCE)
  {
    assert(!stack.empty());
    stack.pop();
    return idx;
  }
  THROW("transition_eager failed");
}